

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avsd_parse.c
# Opt level: O0

AvsdFrame_t * get_one_save(AvsdCtx_t *p_dec,HalDecTask *task)

{
  AvsdCtx_t *local_30;
  AvsdFrame_t *p_cur;
  RK_U32 i;
  HalDecTask *task_local;
  AvsdCtx_t *p_dec_local;
  
  local_30 = (AvsdCtx_t *)0x0;
  p_cur._4_4_ = 0;
  do {
    if (2 < p_cur._4_4_) {
LAB_001a88d5:
      if (local_30 == (AvsdCtx_t *)0x0) {
        _mpp_log_l(2,"avsd_parse","mem_save dpb %d slots has not get\n",(char *)0x0,3);
        reset_one_save((AvsdFrame_t *)0x0);
        p_dec_local = (AvsdCtx_t *)0x0;
      }
      else {
        p_dec_local = local_30;
      }
      return (AvsdFrame_t *)p_dec_local;
    }
    if (p_dec->mem->save[p_cur._4_4_].valid == 0) {
      p_dec->mem->save[p_cur._4_4_].valid = 1;
      local_30 = (AvsdCtx_t *)(p_dec->mem->save + p_cur._4_4_);
      goto LAB_001a88d5;
    }
    p_cur._4_4_ = p_cur._4_4_ + 1;
  } while( true );
}

Assistant:

static AvsdFrame_t *get_one_save(AvsdCtx_t *p_dec, HalDecTask *task)
{
    RK_U32 i = 0;
    AvsdFrame_t *p_cur = NULL;

    for (i = 0; i < MPP_ARRAY_ELEMS(p_dec->mem->save); i++) {
        if (!p_dec->mem->save[i].valid) {
            p_dec->mem->save[i].valid = 1;
            p_cur = &p_dec->mem->save[i];
            break;
        }
    }
    if (!p_cur) {
        mpp_err("mem_save dpb %d slots has not get\n", MPP_ARRAY_ELEMS(p_dec->mem->save));
        goto __FAILED;
    }
    (void)task;
    return p_cur;
__FAILED:
    reset_one_save(p_cur);

    return NULL;
}